

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall
QPDF::ForeignStreamData::ForeignStreamData
          (ForeignStreamData *this,shared_ptr<QPDF::EncryptionParameters> *encp,
          shared_ptr<InputSource> *file,QPDFObjGen foreign_og,qpdf_offset_t offset,size_t length,
          QPDFObjectHandle *param_6,bool is_root_metadata)

{
  bool is_root_metadata_local;
  size_t length_local;
  qpdf_offset_t offset_local;
  shared_ptr<InputSource> *file_local;
  shared_ptr<QPDF::EncryptionParameters> *encp_local;
  ForeignStreamData *this_local;
  QPDFObjGen foreign_og_local;
  
  std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr(&this->encp,encp);
  std::shared_ptr<InputSource>::shared_ptr(&this->file,file);
  this->foreign_og = foreign_og;
  this->offset = offset;
  this->length = length;
  QPDFObjectHandle::QPDFObjectHandle(&this->local_dict,param_6);
  this->is_root_metadata = is_root_metadata;
  return;
}

Assistant:

QPDF::ForeignStreamData::ForeignStreamData(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDFObjGen foreign_og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle local_dict,
    bool is_root_metadata) :
    encp(encp),
    file(file),
    foreign_og(foreign_og),
    offset(offset),
    length(length),
    local_dict(local_dict),
    is_root_metadata(is_root_metadata)
{
}